

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::Runner2::openStream(Runner2 *this)

{
  ostream *poVar1;
  domain_error *this_00;
  ostringstream oss;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  if ((this->m_config->stream)._M_string_length != 0) {
    Config::useStream(this->m_configWrapper,&this->m_config->stream);
  }
  if ((this->m_config->outputFilename)._M_string_length != 0) {
    std::ofstream::open((char *)&this->m_ofs,
                        (_Ios_Openmode)(this->m_config->outputFilename)._M_dataplus._M_p);
    if (((&this->field_0x30)[*(long *)(*(long *)&this->m_ofs + -0x18)] & 5) == 0) {
      std::ios::rdbuf((streambuf *)
                      (&this->m_configWrapper->m_os +
                      *(long *)(*(long *)&this->m_configWrapper->m_os + -0x18)));
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Unable to open file: \'",0x16);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,(this->m_config->outputFilename)._M_dataplus._M_p,
                        (this->m_config->outputFilename)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
    this_00 = (domain_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::domain_error::domain_error(this_00,local_1b0);
    __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  return;
}

Assistant:

void openStream() {
            if( !m_config.stream.empty() )
                m_configWrapper.useStream( m_config.stream );

            // Open output file, if specified
            if( !m_config.outputFilename.empty() ) {
                m_ofs.open( m_config.outputFilename.c_str() );
                if( m_ofs.fail() ) {
                    std::ostringstream oss;
                    oss << "Unable to open file: '" << m_config.outputFilename << "'";
                    throw std::domain_error( oss.str() );
                }
                m_configWrapper.setStreamBuf( m_ofs.rdbuf() );
            }
        }